

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O2

bool __thiscall
cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking
          (cmLinkLineDeviceComputer *this,cmComputeLinkInformation *cli)

{
  pointer pIVar1;
  cmGeneratorTarget *pcVar2;
  bool bVar3;
  TargetType TVar4;
  ItemVector *pIVar5;
  pointer pIVar6;
  string config;
  allocator<char> local_92;
  allocator<char> local_91;
  string local_90 [32];
  string local_70;
  string local_50;
  
  pIVar5 = cmComputeLinkInformation::GetItems(cli);
  std::__cxx11::string::string(local_90,(string *)&cli->Config);
  pIVar1 = (pIVar5->
           super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar6 = (pIVar5->
                super__Vector_base<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                )._M_impl.super__Vector_impl_data._M_start; pIVar6 != pIVar1; pIVar6 = pIVar6 + 1) {
    if (pIVar6->Target != (cmGeneratorTarget *)0x0) {
      TVar4 = cmGeneratorTarget::GetType(pIVar6->Target);
      if (TVar4 == STATIC_LIBRARY) {
        pcVar2 = pIVar6->Target;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"CUDA_RESOLVE_DEVICE_SYMBOLS",&local_91);
        bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_50);
        if (bVar3) {
          std::__cxx11::string::~string((string *)&local_50);
        }
        else {
          pcVar2 = pIVar6->Target;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_70,"CUDA_SEPARABLE_COMPILATION",&local_92);
          bVar3 = cmGeneratorTarget::GetPropertyAsBool(pcVar2,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
          if (bVar3) break;
        }
      }
    }
  }
  std::__cxx11::string::~string(local_90);
  return pIVar6 != pIVar1;
}

Assistant:

bool cmLinkLineDeviceComputer::ComputeRequiresDeviceLinking(
  cmComputeLinkInformation& cli)
{
  // Determine if this item might requires device linking.
  // For this we only consider targets
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  for (auto const& item : items) {
    if (item.Target &&
        item.Target->GetType() == cmStateEnums::STATIC_LIBRARY) {
      if ((!item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS")) &&
          item.Target->GetPropertyAsBool("CUDA_SEPARABLE_COMPILATION")) {
        // this dependency requires us to device link it
        return true;
      }
    }
  }
  return false;
}